

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parse(FfsParser *this,UByteArray *buffer)

{
  bool bVar1;
  USTATUS UVar2;
  UModelIndex root;
  CBString local_60;
  UModelIndex local_48;
  UModelIndex local_30;
  
  local_48.r = -1;
  local_48.c = -1;
  local_48.i = 0;
  local_48.m = (TreeModel *)0x0;
  std::__cxx11::string::_M_assign((string *)&this->openedImage);
  this->imageBase = 0;
  this->addressDiff = 0x100000000;
  this->protectedRegionsBase = 0;
  Bstrlib::CBString::operator=(&this->securityInfo,anon_var_dwarf_263d0 + 0x10);
  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::clear(&this->protectedRanges);
  (this->lastVtf).r = -1;
  (this->lastVtf).c = -1;
  (this->lastVtf).i = 0;
  (this->lastVtf).m = (TreeModel *)0x0;
  (this->dxeCore).r = -1;
  (this->dxeCore).c = -1;
  (this->dxeCore).i = 0;
  (this->dxeCore).m = (TreeModel *)0x0;
  UVar2 = performFirstPass(this,buffer,&local_48);
  if (UVar2 == 0) {
    bVar1 = UModelIndex::isValid(&this->lastVtf);
    if (bVar1) {
      UVar2 = performSecondPass(this,&local_48);
    }
    else {
      usprintf(&local_60,"%s: not a single Volume Top File is found, the image may be corrupted",
               "parse");
      local_30.r = -1;
      local_30.c = -1;
      local_30.i = 0;
      local_30.m = (TreeModel *)0x0;
      msg(this,&local_60,&local_30);
      Bstrlib::CBString::~CBString(&local_60);
      UVar2 = 0;
    }
  }
  addInfoRecursive(this,&local_48);
  return UVar2;
}

Assistant:

USTATUS FfsParser::parse(const UByteArray & buffer)
{
    UModelIndex root;
    
    // Reset global parser state
    openedImage = buffer;
    imageBase = 0;
    addressDiff = 0x100000000ULL;
    protectedRegionsBase = 0;
    securityInfo = "";
    protectedRanges.clear();
    lastVtf = UModelIndex();
    dxeCore = UModelIndex();
    
    // Parse input buffer
    USTATUS result = performFirstPass(buffer, root);
    if (result == U_SUCCESS) {
        if (lastVtf.isValid()) {
            result = performSecondPass(root);
        }
        else {
            msg(usprintf("%s: not a single Volume Top File is found, the image may be corrupted", __FUNCTION__));
        }
    }
    
    addInfoRecursive(root);
    return result;
}